

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints(MeshEdgebreakerEncoder *this)

{
  MeshEdgebreakerEncoderImplInterface *pMVar1;
  pointer puVar2;
  pointer pIVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mesh *pMVar6;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  pointer puVar11;
  size_t sVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  vector<const_draco::MeshAttributeCornerTable_*,_std::allocator<const_draco::MeshAttributeCornerTable_*>_>
  attribute_corner_tables;
  MeshAttributeCornerTable *att_corner_table;
  MeshAttributeCornerTable **local_68;
  iterator iStack_60;
  MeshAttributeCornerTable **local_58;
  long local_50;
  ulong local_48;
  MeshAttributeCornerTable **local_40;
  MeshAttributeCornerTable *local_38;
  long lVar5;
  
  pMVar1 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl;
  if (pMVar1 != (MeshEdgebreakerEncoderImplInterface *)0x0) {
    iVar4 = (*pMVar1->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    lVar5 = CONCAT44(extraout_var,iVar4);
    if (lVar5 != 0) {
      local_50 = *(long *)(lVar5 + 0x30);
      uVar14 = (uint)((ulong)(*(long *)(lVar5 + 0x38) - local_50) >> 2);
      sVar12 = (long)(int)uVar14 - (long)*(int *)(lVar5 + 0x50);
      pMVar6 = (this->super_MeshEncoder).mesh_;
      puVar2 = (pMVar6->super_PointCloud).attributes_.
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (1 < (int)((ulong)((long)puVar2 -
                           (long)(pMVar6->super_PointCloud).attributes_.
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        local_68 = (MeshAttributeCornerTable **)0x0;
        iStack_60._M_current = (MeshAttributeCornerTable **)0x0;
        local_58 = (MeshAttributeCornerTable **)0x0;
        puVar11 = (pMVar6->super_PointCloud).attributes_.
                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)puVar2 - (long)puVar11) >> 3)) {
          uVar18 = 0;
          do {
            if (*(int *)((long)puVar11[uVar18]._M_t.
                               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                               ._M_t + 0x38) != 0) {
              iVar4 = (*(this->super_MeshEncoder).super_PointCloudEncoder._vptr_PointCloudEncoder
                        [0xe])(this,uVar18 & 0xffffffff);
              local_38 = (MeshAttributeCornerTable *)CONCAT44(extraout_var_00,iVar4);
              if (local_38 != (MeshAttributeCornerTable *)0x0) {
                if (iStack_60._M_current == local_58) {
                  std::
                  vector<draco::MeshAttributeCornerTable_const*,std::allocator<draco::MeshAttributeCornerTable_const*>>
                  ::_M_realloc_insert<draco::MeshAttributeCornerTable_const*const&>
                            ((vector<draco::MeshAttributeCornerTable_const*,std::allocator<draco::MeshAttributeCornerTable_const*>>
                              *)&local_68,iStack_60,&local_38);
                }
                else {
                  *iStack_60._M_current = local_38;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
              }
              pMVar6 = (this->super_MeshEncoder).mesh_;
            }
            uVar18 = uVar18 + 1;
            puVar11 = (pMVar6->super_PointCloud).attributes_.
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while ((long)uVar18 <
                   (long)(int)((ulong)((long)(pMVar6->super_PointCloud).attributes_.
                                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar11) >> 3));
          local_50 = *(long *)(lVar5 + 0x30);
          uVar14 = (uint)((ulong)(*(long *)(lVar5 + 0x38) - local_50) >> 2);
        }
        if (uVar14 != 0) {
          local_40 = iStack_60._M_current;
          lVar13 = (long)iStack_60._M_current - (long)local_68 >> 3;
          local_48 = (ulong)uVar14;
          uVar18 = 0;
          do {
            uVar14 = *(uint *)(local_50 + uVar18 * 4);
            if (uVar14 != 0xffffffff) {
              if ((int)uVar14 < 0) {
                IVar17.value_ = 0xffffffff;
              }
              else {
                IVar17.value_ =
                     (pMVar6->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar14 / 3]._M_elems
                     [uVar14 % 3].value_;
              }
              if (uVar14 % 3 == 0) {
                uVar9 = uVar14 + 2;
                if (uVar9 != 0xffffffff) goto LAB_00137d2c;
              }
              else {
                uVar9 = uVar14 - 1;
LAB_00137d2c:
                iVar4 = *(int *)(*(long *)(lVar5 + 0x18) + (ulong)uVar9 * 4);
                if (iVar4 != -1) {
                  if (0x55555555 < (uint)(iVar4 * -0x55555555)) {
                    uVar9 = iVar4 - 1;
LAB_00137d5d:
                    lVar19 = 0;
                    uVar15 = uVar14;
                    do {
                      uVar10 = uVar9;
                      if ((int)uVar10 < 0) {
                        IVar7.value_ = 0xffffffff;
                      }
                      else {
                        IVar7.value_ = (pMVar6->faces_).vector_.
                                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar10 / 3].
                                       _M_elems[uVar10 % 3].value_;
                      }
                      if (IVar7.value_ == IVar17.value_) {
                        if (iStack_60._M_current != local_68) {
                          lVar16 = 0;
                          do {
                            pIVar3 = (local_68[lVar16]->corner_to_vertex_map_).
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            IVar7.value_ = IVar17.value_;
                            if (pIVar3[uVar10].value_ != pIVar3[uVar15].value_) goto LAB_00137dd3;
                            lVar16 = lVar16 + 1;
                          } while (lVar13 + (ulong)(lVar13 == 0) != lVar16);
                        }
                      }
                      else {
LAB_00137dd3:
                        IVar17.value_ = IVar7.value_;
                        lVar19 = lVar19 + 1;
                      }
                      if (uVar10 == uVar14) goto LAB_00137e3c;
                      if (uVar10 * -0x55555555 < 0x55555556) {
                        uVar9 = uVar10 + 2;
                        if (uVar9 == 0xffffffff) goto LAB_00137e3c;
                      }
                      else {
                        uVar9 = uVar10 - 1;
                      }
                      iVar4 = *(int *)(*(long *)(lVar5 + 0x18) + (ulong)uVar9 * 4);
                      if ((iVar4 == -1) ||
                         (uVar9 = (((uint)(iVar4 * -0x55555555) < 0x55555556) - 1 | 2) + iVar4,
                         uVar15 = uVar10, uVar9 == 0xffffffff)) goto LAB_00137e3c;
                    } while( true );
                  }
                  uVar9 = iVar4 + 2;
                  if (uVar9 != 0xffffffff) goto LAB_00137d5d;
                }
              }
              lVar19 = 0;
LAB_00137e3c:
              uVar9 = uVar14 - 2;
              if (0x55555555 < (uVar14 + 1) * -0x55555555) {
                uVar9 = uVar14 + 1;
              }
              if ((uVar9 == 0xffffffff) ||
                 (iVar4 = *(int *)(*(long *)(lVar5 + 0x18) + (ulong)uVar9 * 4), iVar4 == -1)) {
                bVar20 = false;
              }
              else {
                iVar8 = iVar4 + -2;
                if (0x55555555 < (uint)((iVar4 + 1) * -0x55555555)) {
                  iVar8 = iVar4 + 1;
                }
                bVar20 = iVar8 != -1;
              }
              sVar12 = (sVar12 + lVar19) - (ulong)(byte)(lVar19 != 0 & bVar20);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_48);
        }
        if (local_68 != (MeshAttributeCornerTable **)0x0) {
          operator_delete(local_68,(long)local_58 - (long)local_68);
        }
      }
      (this->super_MeshEncoder).super_PointCloudEncoder.num_encoded_points_ = sVar12;
    }
  }
  return;
}

Assistant:

void MeshEdgebreakerEncoder::ComputeNumberOfEncodedPoints() {
  if (!impl_) {
    return;
  }
  const CornerTable *const corner_table = impl_->GetCornerTable();
  if (!corner_table) {
    return;
  }
  size_t num_points =
      corner_table->num_vertices() - corner_table->NumIsolatedVertices();

  if (mesh()->num_attributes() > 1) {
    // Gather all corner tables for all non-position attributes.
    std::vector<const MeshAttributeCornerTable *> attribute_corner_tables;
    for (int i = 0; i < mesh()->num_attributes(); ++i) {
      if (mesh()->attribute(i)->attribute_type() ==
          GeometryAttribute::POSITION) {
        continue;
      }
      const MeshAttributeCornerTable *const att_corner_table =
          GetAttributeCornerTable(i);
      // Attribute corner table may not be used in some configurations. For
      // these cases we can assume the attribute connectivity to be the same as
      // the connectivity of the position data.
      if (att_corner_table) {
        attribute_corner_tables.push_back(att_corner_table);
      }
    }

    // Add a new point based on the configuration of interior attribute seams
    // (replicating what the decoder would do).
    for (VertexIndex vi(0); vi < corner_table->num_vertices(); ++vi) {
      if (corner_table->IsVertexIsolated(vi)) {
        continue;
      }
      // Go around all corners of the vertex and keep track of the observed
      // attribute seams.
      const CornerIndex first_corner_index = corner_table->LeftMostCorner(vi);
      const PointIndex first_point_index =
          mesh()->CornerToPointId(first_corner_index);

      PointIndex last_point_index = first_point_index;
      CornerIndex last_corner_index = first_corner_index;
      CornerIndex corner_index = corner_table->SwingRight(first_corner_index);
      size_t num_attribute_seams = 0;
      while (corner_index != kInvalidCornerIndex) {
        const PointIndex point_index = mesh()->CornerToPointId(corner_index);
        bool seam_found = false;
        if (point_index != last_point_index) {
          // Point index changed - new attribute seam detected.
          seam_found = true;
          last_point_index = point_index;
        } else {
          // Even though point indices matches, there still may be a seam caused
          // by non-manifold connectivity of non-position attribute data.
          for (int i = 0; i < attribute_corner_tables.size(); ++i) {
            if (attribute_corner_tables[i]->Vertex(corner_index) !=
                attribute_corner_tables[i]->Vertex(last_corner_index)) {
              seam_found = true;
              break;  // No need to process other attributes.
            }
          }
        }
        if (seam_found) {
          ++num_attribute_seams;
        }

        if (corner_index == first_corner_index) {
          break;
        }

        // Proceed to the next corner
        last_corner_index = corner_index;
        corner_index = corner_table->SwingRight(corner_index);
      }

      if (!corner_table->IsOnBoundary(vi) && num_attribute_seams > 0) {
        // If the last visited point index is the same as the first point index
        // we traveled all the way around the vertex. In this case the number of
        // new points should be num_attribute_seams - 1
        num_points += num_attribute_seams - 1;
      } else {
        // Else the vertex was either on a boundary (i.e. we couldn't travel all
        // around the vertex), or we ended up at a different point. In both of
        // these cases, the number of new points is equal to the number of
        // attribute seams.
        num_points += num_attribute_seams;
      }
    }
  }
  set_num_encoded_points(num_points);
}